

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

string * __thiscall
CLI::Option::get_flag_value
          (string *__return_storage_ptr__,Option *this,string *name,string *input_value)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference pvVar6;
  ArgumentMismatch *pAVar7;
  int64_t iVar8;
  string *local_1a8;
  string *local_1a0;
  invalid_argument *anon_var_0;
  int64_t local_118;
  int64_t val;
  string local_f8;
  size_type local_d8;
  ptrdiff_t ind;
  string local_c8;
  undefined1 local_a1;
  string local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_68;
  size_type local_48;
  ptrdiff_t default_ind;
  allocator local_29;
  string *local_28;
  string *input_value_local;
  string *name_local;
  Option *this_local;
  
  local_28 = input_value;
  input_value_local = name;
  name_local = (string *)this;
  this_local = (Option *)__return_storage_ptr__;
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::trueString_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::trueString_abi_cxx11_), iVar3 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)
               &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                trueString_abi_cxx11_,"true",&local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         trueString_abi_cxx11_);
  }
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::falseString_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::falseString_abi_cxx11_), iVar3 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)
               &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                falseString_abi_cxx11_,"false",(allocator *)((long)&default_ind + 3));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&default_ind + 3));
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         falseString_abi_cxx11_);
  }
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::emptyString_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::emptyString_abi_cxx11_), iVar3 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)
               &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                emptyString_abi_cxx11_,"{}",(allocator *)((long)&default_ind + 2));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&default_ind + 2));
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  emptyString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         emptyString_abi_cxx11_);
  }
  if (((((this->super_OptionBase<CLI::Option>).disable_flag_override_ & 1U) != 0) &&
      (uVar4 = ::std::__cxx11::string::empty(), (uVar4 & 1) == 0)) &&
     (_Var1 = ::std::operator==(input_value,
                                &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                                 emptyString_abi_cxx11_), !_Var1)) {
    ::std::__cxx11::string::string((string *)&local_68,(string *)input_value_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_80,&this->fnames_);
    sVar5 = detail::find_member(&local_68,&local_80,
                                (bool)((this->super_OptionBase<CLI::Option>).ignore_case_ & 1),
                                (bool)((this->super_OptionBase<CLI::Option>).ignore_underscore_ & 1)
                               );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_80);
    ::std::__cxx11::string::~string((string *)&local_68);
    local_48 = sVar5;
    if ((long)sVar5 < 0) {
      bVar2 = ::std::operator!=(input_value,
                                &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                                 trueString_abi_cxx11_);
      if (bVar2) {
        ind._7_1_ = 1;
        pAVar7 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_c8,(string *)input_value_local);
        ArgumentMismatch::FlagOverride(pAVar7,&local_c8);
        ind._7_1_ = 0;
        __cxa_throw(pAVar7,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
      }
    }
    else {
      pvVar6 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->default_flag_values_,sVar5);
      bVar2 = ::std::operator!=(&pvVar6->second,input_value);
      if (bVar2) {
        local_a1 = 1;
        pAVar7 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_a0,(string *)input_value_local);
        ArgumentMismatch::FlagOverride(pAVar7,&local_a0);
        local_a1 = 0;
        __cxa_throw(pAVar7,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
      }
    }
  }
  ::std::__cxx11::string::string((string *)&local_f8,(string *)input_value_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&val,&this->fnames_);
  sVar5 = detail::find_member(&local_f8,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&val,(bool)((this->super_OptionBase<CLI::Option>).ignore_case_ & 1)
                              ,(bool)((this->super_OptionBase<CLI::Option>).ignore_underscore_ & 1))
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&val);
  ::std::__cxx11::string::~string((string *)&local_f8);
  local_d8 = sVar5;
  uVar4 = ::std::__cxx11::string::empty();
  if (((uVar4 & 1) != 0) ||
     (_Var1 = ::std::operator==(input_value,
                                &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                                 emptyString_abi_cxx11_), _Var1)) {
    if ((this->flag_like_ & 1U) == 0) {
      if ((long)local_d8 < 0) {
        local_1a8 = (string *)&this->default_str_;
      }
      else {
        pvVar6 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->default_flag_values_,local_d8);
        local_1a8 = (string *)&pvVar6->second;
      }
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,local_1a8);
    }
    else {
      if ((long)local_d8 < 0) {
        local_1a0 = &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                     trueString_abi_cxx11_;
      }
      else {
        pvVar6 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->default_flag_values_,local_d8);
        local_1a0 = &pvVar6->second;
      }
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_1a0);
    }
  }
  else if ((long)local_d8 < 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input_value);
  }
  else {
    pvVar6 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->default_flag_values_,local_d8);
    _Var1 = ::std::operator==(&pvVar6->second,
                              &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                               falseString_abi_cxx11_);
    if (_Var1) {
      ::std::__cxx11::string::string((string *)&anon_var_0,(string *)input_value);
      iVar8 = detail::to_flag_value((string *)&anon_var_0);
      ::std::__cxx11::string::~string((string *)&anon_var_0);
      local_118 = iVar8;
      if (iVar8 == 1) {
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,
                   (string *)
                   &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                    falseString_abi_cxx11_);
      }
      else if (iVar8 == -1) {
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,
                   (string *)
                   &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                    trueString_abi_cxx11_);
      }
      else {
        std::__cxx11::to_string(__return_storage_ptr__,-iVar8);
      }
    }
    else {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input_value);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_flag_value(const std::string &name, std::string input_value) const {
        static const std::string trueString{"true"};
        static const std::string falseString{"false"};
        static const std::string emptyString{"{}"};
        // check for disable flag override_
        if(disable_flag_override_) {
            if(!((input_value.empty()) || (input_value == emptyString))) {
                auto default_ind = detail::find_member(name, fnames_, ignore_case_, ignore_underscore_);
                if(default_ind >= 0) {
                    // We can static cast this to std::size_t because it is more than 0 in this block
                    if(default_flag_values_[static_cast<std::size_t>(default_ind)].second != input_value) {
                        throw(ArgumentMismatch::FlagOverride(name));
                    }
                } else {
                    if(input_value != trueString) {
                        throw(ArgumentMismatch::FlagOverride(name));
                    }
                }
            }
        }
        auto ind = detail::find_member(name, fnames_, ignore_case_, ignore_underscore_);
        if((input_value.empty()) || (input_value == emptyString)) {
            if(flag_like_) {
                return (ind < 0) ? trueString : default_flag_values_[static_cast<std::size_t>(ind)].second;
            } else {
                return (ind < 0) ? default_str_ : default_flag_values_[static_cast<std::size_t>(ind)].second;
            }
        }
        if(ind < 0) {
            return input_value;
        }
        if(default_flag_values_[static_cast<std::size_t>(ind)].second == falseString) {
            try {
                auto val = detail::to_flag_value(input_value);
                return (val == 1) ? falseString : (val == (-1) ? trueString : std::to_string(-val));
            } catch(const std::invalid_argument &) {
                return input_value;
            }
        } else {
            return input_value;
        }
    }